

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSource(FileGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  string *psVar5;
  FileDescriptor *this_00;
  ulong uVar6;
  size_type sVar7;
  reference ppMVar8;
  Descriptor *this_01;
  reference ppEVar9;
  protobuf *ppVar10;
  reference ppSVar11;
  reference ppEVar12;
  undefined1 qualified;
  int i_00;
  char *__rhs;
  unsigned_long i_01;
  unsigned_long i_02;
  char *local_270;
  char *local_258;
  int local_230;
  int local_22c;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  int local_180;
  int local_17c;
  int i_3;
  int i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string parent;
  undefined1 local_110 [4];
  int i_1;
  undefined1 local_f0 [8];
  string dependency;
  char *extension;
  FileDescriptor *dep;
  int i;
  allocator<char> local_91;
  string local_90;
  string local_60;
  undefined1 local_40 [8];
  string header;
  bool use_system_include;
  Printer *printer_local;
  FileGenerator *this_local;
  
  header.field_2._M_local_buf[0xf] = IsWellKnownMessage(this->file_);
  psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
  StripProto(&local_60,psVar5);
  __rhs = ".pb.h";
  if (((this->options_).proto_h & 1U) != 0) {
    __rhs = ".proto.h";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,__rhs);
  std::__cxx11::string::~string((string *)&local_60);
  psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
  if ((header.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_258 = "\"";
  }
  else {
    local_258 = "<";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,local_258,&local_91);
  if ((header.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_270 = "\"";
  }
  else {
    local_270 = ">";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,local_270,(allocator<char> *)((long)&dep + 7));
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n#define INTERNAL_SUPPRESS_PROTOBUF_FIELD_DEPRECATION\n#include $left$$header$$right$\n\n#include <algorithm>\n\n#include <google/protobuf/stubs/common.h>\n#include <google/protobuf/stubs/port.h>\n#include <google/protobuf/stubs/once.h>\n#include <google/protobuf/io/coded_stream.h>\n#include <google/protobuf/wire_format_lite_inl.h>\n"
                     ,"filename",psVar5,"header",(string *)local_40,"left",&local_90,"right",
                     (string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&dep + 7));
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  bVar1 = UseUnknownFieldSet(this->file_,&this->options_);
  if ((!bVar1) &&
     (bVar1 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::empty(&this->message_generators_), !bVar1)) {
    io::Printer::Print(printer,"#include <google/protobuf/io/zero_copy_stream_impl_lite.h>\n");
  }
  bVar1 = HasDescriptorMethods(this->file_,&this->options_);
  if (bVar1) {
    io::Printer::Print(printer,
                       "#include <google/protobuf/descriptor.h>\n#include <google/protobuf/generated_message_reflection.h>\n#include <google/protobuf/reflection_ops.h>\n#include <google/protobuf/wire_format.h>\n"
                      );
  }
  if (((this->options_).proto_h & 1U) != 0) {
    for (dep._0_4_ = 0; iVar3 = (int)dep, iVar2 = FileDescriptor::dependency_count(this->file_),
        iVar3 < iVar2; dep._0_4_ = (int)dep + 1) {
      this_00 = FileDescriptor::dependency(this->file_,(int)dep);
      dependency.field_2._8_8_ = anon_var_dwarf_3500e;
      psVar5 = FileDescriptor::name_abi_cxx11_(this_00);
      StripProto((string *)local_110,psVar5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     (char *)dependency.field_2._8_8_);
      std::__cxx11::string::~string((string *)local_110);
      io::Printer::Print(printer,"#include \"$dependency$\"\n","dependency",(string *)local_f0);
      std::__cxx11::string::~string((string *)local_f0);
    }
  }
  io::Printer::Print(printer,"// @@protoc_insertion_point(includes)\n");
  GenerateNamespaceOpeners(this,printer);
  for (parent.field_2._12_4_ = 0; uVar6 = (ulong)(int)parent.field_2._12_4_,
      sVar7 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::size(&this->message_generators_), uVar6 < sVar7;
      parent.field_2._12_4_ = parent.field_2._12_4_ + 1) {
    std::__cxx11::string::string((string *)local_138);
    qualified = (undefined1)sVar7;
    ppMVar8 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::operator[](&this->message_generators_,(long)(int)parent.field_2._12_4_);
    bVar1 = IsMapEntryMessage((*ppMVar8)->descriptor_);
    if (bVar1) {
      ppMVar8 = std::
                vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ::operator[](&this->message_generators_,(long)(int)parent.field_2._12_4_);
      this_01 = Descriptor::containing_type((*ppMVar8)->descriptor_);
      ClassName_abi_cxx11_((string *)&i_3,(cpp *)this_01,(Descriptor *)0x0,(bool)qualified);
      std::operator+(&local_158,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_3,"::")
      ;
      std::__cxx11::string::operator=((string *)local_138,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&i_3);
    }
    ppMVar8 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::operator[](&this->message_generators_,(long)(int)parent.field_2._12_4_);
    io::Printer::Print(printer,
                       "class $classname$DefaultTypeInternal : public ::google::protobuf::internal::ExplicitlyConstructed<$parent$$classname$> {\n"
                       ,"parent",(string *)local_138,"classname",&(*ppMVar8)->classname_);
    io::Printer::Indent(printer);
    ppMVar8 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::operator[](&this->message_generators_,(long)(int)parent.field_2._12_4_);
    MessageGenerator::GenerateExtraDefaultFields(*ppMVar8,printer);
    io::Printer::Outdent(printer);
    ppMVar8 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::operator[](&this->message_generators_,(long)(int)parent.field_2._12_4_);
    io::Printer::Print(printer,"} _$classname$_default_instance_;\n","classname",
                       &(*ppMVar8)->classname_);
    std::__cxx11::string::~string((string *)local_138);
  }
  for (local_17c = 0; uVar6 = (ulong)local_17c,
      sVar7 = std::
              vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
              ::size(&this->enum_generators_), iVar3 = local_17c, uVar6 < sVar7;
      local_17c = local_17c + 1) {
    ppEVar9 = std::
              vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
              ::operator[](&this->enum_generators_,(long)local_17c);
    (*ppEVar9)->index_in_metadata_ = iVar3;
  }
  bVar1 = HasGenericServices(this->file_,&this->options_);
  if (bVar1) {
    for (local_180 = 0; uVar6 = (ulong)local_180,
        sVar7 = std::
                vector<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                ::size(&this->service_generators_), iVar3 = local_180, uVar6 < sVar7;
        local_180 = local_180 + 1) {
      ppSVar11 = std::
                 vector<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                 ::operator[](&this->service_generators_,(long)local_180);
      (*ppSVar11)->index_in_metadata_ = iVar3;
    }
  }
  psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
  FileLevelNamespace(&local_1a0,psVar5);
  io::Printer::Print(printer,"\nnamespace $file_namespace$ {\n\n","file_namespace",&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  bVar1 = HasDescriptorMethods(this->file_,&this->options_);
  if (bVar1) {
    io::Printer::Print(printer,"\nnamespace {\n\n");
    bVar1 = std::
            vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ::empty(&this->message_generators_);
    if (!bVar1) {
      ppVar10 = (protobuf *)
                std::
                vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ::size(&this->message_generators_);
      SimpleItoa_abi_cxx11_(&local_1c0,ppVar10,i_01);
      io::Printer::Print(printer,"::google::protobuf::Metadata file_level_metadata[$size$];\n",
                         "size",&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
    }
    bVar1 = std::
            vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
            ::empty(&this->enum_generators_);
    if (!bVar1) {
      ppVar10 = (protobuf *)
                std::
                vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                ::size(&this->enum_generators_);
      SimpleItoa_abi_cxx11_(&local_1e0,ppVar10,i_02);
      io::Printer::Print(printer,
                         "const ::google::protobuf::EnumDescriptor* file_level_enum_descriptors[$size$];\n"
                         ,"size",&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    bVar1 = HasGenericServices(this->file_,&this->options_);
    if ((bVar1) && (iVar3 = FileDescriptor::service_count(this->file_), 0 < iVar3)) {
      uVar4 = FileDescriptor::service_count(this->file_);
      SimpleItoa_abi_cxx11_(&local_200,(protobuf *)(ulong)uVar4,i_00);
      io::Printer::Print(printer,
                         "const ::google::protobuf::ServiceDescriptor* file_level_service_descriptors[$size$];\n"
                         ,"size",&local_200);
      std::__cxx11::string::~string((string *)&local_200);
    }
    io::Printer::Print(printer,"\n}  // namespace\n\n");
  }
  GenerateBuildDescriptors(this,printer);
  psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
  FileLevelNamespace((string *)&i_5,psVar5);
  io::Printer::Print(printer,"\n}  // namespace $file_namespace$\n\n","file_namespace",
                     (string *)&i_5);
  std::__cxx11::string::~string((string *)&i_5);
  for (i_6 = 0; sVar7 = std::
                        vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                        ::size(&this->enum_generators_), (ulong)(long)i_6 < sVar7; i_6 = i_6 + 1) {
    ppEVar9 = std::
              vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
              ::operator[](&this->enum_generators_,(long)i_6);
    EnumGenerator::GenerateMethods(*ppEVar9,printer);
  }
  for (i_7 = 0; sVar7 = std::
                        vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                        ::size(&this->message_generators_), (ulong)(long)i_7 < sVar7; i_7 = i_7 + 1)
  {
    io::Printer::Print(printer,"\n");
    io::Printer::Print(printer,
                       "// ===================================================================\n");
    io::Printer::Print(printer,"\n");
    ppMVar8 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::operator[](&this->message_generators_,(long)i_7);
    MessageGenerator::GenerateClassMethods(*ppMVar8,printer);
    io::Printer::Print(printer,"#if PROTOBUF_INLINE_NOT_IN_HEADERS\n");
    ppMVar8 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::operator[](&this->message_generators_,(long)i_7);
    MessageGenerator::GenerateInlineMethods(*ppMVar8,printer,false);
    io::Printer::Print(printer,"#endif  // PROTOBUF_INLINE_NOT_IN_HEADERS\n");
  }
  bVar1 = HasGenericServices(this->file_,&this->options_);
  if (bVar1) {
    for (local_22c = 0;
        sVar7 = std::
                vector<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                ::size(&this->service_generators_), (ulong)(long)local_22c < sVar7;
        local_22c = local_22c + 1) {
      if (local_22c == 0) {
        io::Printer::Print(printer,"\n");
      }
      io::Printer::Print(printer,
                         "// ===================================================================\n")
      ;
      io::Printer::Print(printer,"\n");
      ppSVar11 = std::
                 vector<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                 ::operator[](&this->service_generators_,(long)local_22c);
      ServiceGenerator::GenerateImplementation(*ppSVar11,printer);
    }
  }
  for (local_230 = 0;
      sVar7 = std::
              vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
              ::size(&this->extension_generators_), (ulong)(long)local_230 < sVar7;
      local_230 = local_230 + 1) {
    ppEVar12 = std::
               vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
               ::operator[](&this->extension_generators_,(long)local_230);
    ExtensionGenerator::GenerateDefinition(*ppEVar12,printer);
  }
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(namespace_scope)\n");
  GenerateNamespaceClosers(this,printer);
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(global_scope)\n");
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void FileGenerator::GenerateSource(io::Printer* printer) {
  const bool use_system_include = IsWellKnownMessage(file_);
  string header =
      StripProto(file_->name()) + (options_.proto_h ? ".proto.h" : ".pb.h");
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n"
    // The generated code calls accessors that might be deprecated. We don't
    // want the compiler to warn in generated code.
    "#define INTERNAL_SUPPRESS_PROTOBUF_FIELD_DEPRECATION\n"
    "#include $left$$header$$right$\n"
    "\n"
    "#include <algorithm>\n"    // for swap()
    "\n"
    "#include <google/protobuf/stubs/common.h>\n"
    "#include <google/protobuf/stubs/port.h>\n"
    "#include <google/protobuf/stubs/once.h>\n"
    "#include <google/protobuf/io/coded_stream.h>\n"
    "#include <google/protobuf/wire_format_lite_inl.h>\n",
    "filename", file_->name(),
    "header", header,
    "left", use_system_include ? "<" : "\"",
    "right", use_system_include ? ">" : "\"");

  // Unknown fields implementation in lite mode uses StringOutputStream
  if (!UseUnknownFieldSet(file_, options_) && !message_generators_.empty()) {
    printer->Print(
      "#include <google/protobuf/io/zero_copy_stream_impl_lite.h>\n");
  }

  if (HasDescriptorMethods(file_, options_)) {
    printer->Print(
      "#include <google/protobuf/descriptor.h>\n"
      "#include <google/protobuf/generated_message_reflection.h>\n"
      "#include <google/protobuf/reflection_ops.h>\n"
      "#include <google/protobuf/wire_format.h>\n");
  }

  if (options_.proto_h) {
    // Use the smaller .proto.h files.
    for (int i = 0; i < file_->dependency_count(); i++) {
      const FileDescriptor* dep = file_->dependency(i);
      const char* extension = ".proto.h";
      string dependency = StripProto(dep->name()) + extension;
      printer->Print(
          "#include \"$dependency$\"\n",
          "dependency", dependency);
    }
  }

  printer->Print(
    "// @@protoc_insertion_point(includes)\n");

  GenerateNamespaceOpeners(printer);

  for (int i = 0; i < message_generators_.size(); i++) {
    string parent;
    if (IsMapEntryMessage(message_generators_[i]->descriptor_)) {
      parent = ClassName(message_generators_[i]->descriptor_->containing_type(),
                         false) +
               "::";
    }
    printer->Print(
        "class $classname$DefaultTypeInternal : "
        "public ::google::protobuf::internal::ExplicitlyConstructed<$parent$$classname$> "
        "{\n",
        "parent", parent, "classname", message_generators_[i]->classname_);
    printer->Indent();
    message_generators_[i]->GenerateExtraDefaultFields(printer);
    printer->Outdent();
    printer->Print(
        "} _$classname$_default_instance_;\n",
        "classname", message_generators_[i]->classname_);
  }

  for (int i = 0; i < enum_generators_.size(); i++) {
    enum_generators_[i]->index_in_metadata_ = i;
  }
  if (HasGenericServices(file_, options_)) {
    for (int i = 0; i < service_generators_.size(); i++) {
      service_generators_[i]->index_in_metadata_ = i;
    }
  }

  printer->Print(
      "\n"
      "namespace $file_namespace$ {\n"
      "\n",
      "file_namespace", FileLevelNamespace(file_->name()));

  if (HasDescriptorMethods(file_, options_)) {
    printer->Print(
      "\n"
      "namespace {\n"
      "\n");

    if (!message_generators_.empty()) {
      printer->Print("::google::protobuf::Metadata file_level_metadata[$size$];\n",
                     "size", SimpleItoa(message_generators_.size()));
    }
    if (!enum_generators_.empty()) {
      printer->Print(
          "const ::google::protobuf::EnumDescriptor* "
          "file_level_enum_descriptors[$size$];\n",
          "size", SimpleItoa(enum_generators_.size()));
    }
    if (HasGenericServices(file_, options_) && file_->service_count() > 0) {
      printer->Print(
          "const ::google::protobuf::ServiceDescriptor* "
          "file_level_service_descriptors[$size$];\n",
          "size", SimpleItoa(file_->service_count()));
    }

    printer->Print(
      "\n"
      "}  // namespace\n"
      "\n");
  }

  // Define our externally-visible BuildDescriptors() function.  (For the lite
  // library, all this does is initialize default instances.)
  GenerateBuildDescriptors(printer);

  printer->Print(
      "\n"
      "}  // namespace $file_namespace$\n"
      "\n",
      "file_namespace", FileLevelNamespace(file_->name()));

  // Generate enums.
  for (int i = 0; i < enum_generators_.size(); i++) {
    enum_generators_[i]->GenerateMethods(printer);
  }

  // Generate classes.
  for (int i = 0; i < message_generators_.size(); i++) {
    printer->Print("\n");
    printer->Print(kThickSeparator);
    printer->Print("\n");
    message_generators_[i]->GenerateClassMethods(printer);

    printer->Print("#if PROTOBUF_INLINE_NOT_IN_HEADERS\n");
    // Generate class inline methods.
    message_generators_[i]->GenerateInlineMethods(printer,
                                                  /* is_inline = */ false);
    printer->Print("#endif  // PROTOBUF_INLINE_NOT_IN_HEADERS\n");
  }

  if (HasGenericServices(file_, options_)) {
    // Generate services.
    for (int i = 0; i < service_generators_.size(); i++) {
      if (i == 0) printer->Print("\n");
      printer->Print(kThickSeparator);
      printer->Print("\n");
      service_generators_[i]->GenerateImplementation(printer);
    }
  }

  // Define extensions.
  for (int i = 0; i < extension_generators_.size(); i++) {
    extension_generators_[i]->GenerateDefinition(printer);
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(namespace_scope)\n");

  GenerateNamespaceClosers(printer);

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(global_scope)\n");
}